

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Forel.cpp
# Opt level: O1

Point * __thiscall
Forel::mass_centre(Point *__return_storage_ptr__,Forel *this,
                  vector<Point,_std::allocator<Point>_> *points,
                  vector<int,_std::allocator<int>_> *inside_circle)

{
  int iVar1;
  pointer piVar2;
  pointer pPVar3;
  uint uVar4;
  ulong uVar5;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  
  piVar2 = (inside_circle->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (uint)((ulong)((long)(inside_circle->super__Vector_base<int,_std::allocator<int>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)piVar2) >> 2);
  if (0 < (int)uVar4) {
    pPVar3 = (points->super__Vector_base<Point,_std::allocator<Point>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      iVar1 = piVar2[uVar5];
      in_XMM0_Qa = in_XMM0_Qa + pPVar3[iVar1].x;
      in_XMM1_Qa = in_XMM1_Qa + pPVar3[iVar1].y;
      uVar5 = uVar5 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar5);
  }
  Point::Point(__return_storage_ptr__,in_XMM0_Qa / (double)(int)uVar4,
               in_XMM1_Qa / (double)(int)uVar4);
  return __return_storage_ptr__;
}

Assistant:

Point Forel::mass_centre(vector<Point> points, vector<int> inside_circle) {
    double x, y;
    for (int i = 0; i < (int) inside_circle.size(); i++) {
        x += points[inside_circle[i]].x;
        y += points[inside_circle[i]].y;

    }
    x = x / (int) inside_circle.size();
    y = y / (int) inside_circle.size();
    return Point(x, y);
}